

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O3

void __thiscall
Json::Reader::addComment(Reader *this,Location begin,Location end,CommentPlacement placement)

{
  Value *this_00;
  undefined4 in_register_0000000c;
  String local_58;
  String local_38;
  
  if (this->collectComments_ == false) {
    __assert_fail("collectComments_",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/hbrunie[P]PyFloT/external-deps/jsoncpp/src/lib_json/json_reader.cpp"
                  ,0x17e,"void Json::Reader::addComment(Location, Location, CommentPlacement)");
  }
  normalizeEOL_abi_cxx11_
            (&local_58,(Reader *)begin,end,(Location)CONCAT44(in_register_0000000c,placement));
  if (placement == commentAfterOnSameLine) {
    this_00 = this->lastValue_;
    if (this_00 == (Value *)0x0) {
      __assert_fail("lastValue_ != nullptr",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/hbrunie[P]PyFloT/external-deps/jsoncpp/src/lib_json/json_reader.cpp"
                    ,0x181,"void Json::Reader::addComment(Location, Location, CommentPlacement)");
    }
    local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_38,local_58._M_dataplus._M_p,
               local_58._M_dataplus._M_p + local_58._M_string_length);
    Value::setComment(this_00,&local_38,commentAfterOnSameLine);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p);
    }
  }
  else {
    std::__cxx11::string::_M_append((char *)&this->commentsBefore_,(ulong)local_58._M_dataplus._M_p)
    ;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  return;
}

Assistant:

void Reader::addComment(Location begin,
                        Location end,
                        CommentPlacement placement) {
  assert(collectComments_);
  const String& normalized = normalizeEOL(begin, end);
  if (placement == commentAfterOnSameLine) {
    assert(lastValue_ != nullptr);
    lastValue_->setComment(normalized, placement);
  } else {
    commentsBefore_ += normalized;
  }
}